

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

CharString * __thiscall
icu_63::CharString::copyFrom(CharString *this,CharString *s,UErrorCode *errorCode)

{
  UBool UVar1;
  char *__dest;
  char *__src;
  UErrorCode *errorCode_local;
  CharString *s_local;
  CharString *this_local;
  
  UVar1 = U_SUCCESS(*errorCode);
  if ((UVar1 != '\0') && (this != s)) {
    UVar1 = ensureCapacity(this,s->len + 1,0,errorCode);
    if (UVar1 != '\0') {
      this->len = s->len;
      __dest = MaybeStackArray<char,_40>::getAlias(&this->buffer);
      __src = MaybeStackArray<char,_40>::getAlias(&s->buffer);
      memcpy(__dest,__src,(long)(this->len + 1));
    }
  }
  return this;
}

Assistant:

CharString &CharString::copyFrom(const CharString &s, UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && this!=&s && ensureCapacity(s.len+1, 0, errorCode)) {
        len=s.len;
        uprv_memcpy(buffer.getAlias(), s.buffer.getAlias(), len+1);
    }
    return *this;
}